

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionProxy::HasValidProfileEntryPoint(FunctionProxy *this)

{
  JavascriptMethod codeAddress;
  bool bVar1;
  BOOL BVar2;
  ProxyEntryPointInfo *pPVar3;
  JavascriptMethod p_Var4;
  FunctionBody *this_00;
  bool local_3b;
  bool local_3a;
  bool local_39;
  FunctionBody *functionBody;
  JavascriptMethod originalEntryPoint;
  JavascriptMethod directEntryPoint;
  FunctionProxy *this_local;
  
  pPVar3 = GetDefaultEntryPointInfo(this);
  codeAddress = (JavascriptMethod)pPVar3->jsMethod;
  p_Var4 = GetOriginalEntryPoint_Unchecked(this);
  if (p_Var4 == JavascriptFunction::DeferredParsingThunk) {
    this_local._7_1_ = codeAddress == ScriptContext::ProfileModeDeferredParsingThunk;
  }
  else if (p_Var4 == JavascriptFunction::DeferredDeserializeThunk) {
    this_local._7_1_ = codeAddress == ScriptContext::ProfileModeDeferredDeserializeThunk;
  }
  else {
    bVar1 = IsFunctionBody(this);
    if (bVar1) {
      this_00 = GetFunctionBody(this);
      BVar2 = FunctionBody::IsInterpreterThunk(this_00);
      if ((BVar2 != 0) || (bVar1 = FunctionBody::IsSimpleJitOriginalEntryPoint(this_00), bVar1)) {
        local_39 = true;
        if (codeAddress != ScriptContext::DebugProfileProbeThunk) {
          BVar2 = IsIntermediateCodeGenThunk(codeAddress);
          local_39 = BVar2 != 0;
        }
        this_local._7_1_ = local_39;
      }
      else {
        BVar2 = FunctionBody::IsNativeOriginalEntryPoint(this_00);
        local_3a = false;
        if (BVar2 != 0) {
          local_3b = codeAddress == DynamicProfileInfo::EnsureDynamicProfileInfoThunk ||
                     codeAddress == ScriptContext::DebugProfileProbeThunk;
          local_3a = local_3b;
        }
        this_local._7_1_ = local_3a;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionProxy::HasValidProfileEntryPoint() const
    {
        JavascriptMethod directEntryPoint = this->GetDefaultEntryPointInfo()->jsMethod;
        JavascriptMethod originalEntryPoint = this->GetOriginalEntryPoint_Unchecked();

        if (originalEntryPoint == DefaultDeferredParsingThunk)
        {
            return directEntryPoint == ProfileDeferredParsingThunk;
        }
        if (originalEntryPoint == DefaultDeferredDeserializeThunk)
        {
            return directEntryPoint == ProfileDeferredDeserializeThunk;
        }
        if (!this->IsFunctionBody())
        {
            return false;
        }

#if ENABLE_PROFILE_INFO
        FunctionBody * functionBody = this->GetFunctionBody();
        if (functionBody->IsInterpreterThunk() || functionBody->IsSimpleJitOriginalEntryPoint())
        {
            return directEntryPoint == ProfileEntryThunk || IsIntermediateCodeGenThunk(directEntryPoint);
        }

#if ENABLE_NATIVE_CODEGEN
        // In the profiler mode, the EnsureDynamicProfileInfoThunk is valid as we would be assigning to appropriate thunk when that thunk called.
        return functionBody->IsNativeOriginalEntryPoint() &&
            (directEntryPoint == DynamicProfileInfo::EnsureDynamicProfileInfoThunk || directEntryPoint == ProfileEntryThunk);
#endif
#else
        return true;
#endif
    }